

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycle_timer.cc
# Opt level: O1

int64_t __thiscall draco::DracoTimer::GetInMs(DracoTimer *this)

{
  return ((this->tv_end_).tv_usec - (this->tv_start_).tv_usec) / 1000 +
         ((this->tv_end_).tv_sec - (this->tv_start_).tv_sec) * 1000;
}

Assistant:

int64_t DracoTimer::GetInMs() {
#ifdef _WIN32
  LARGE_INTEGER elapsed = {0};
  elapsed.QuadPart = tv_end_.QuadPart - tv_start_.QuadPart;

  LARGE_INTEGER frequency = {0};
  QueryPerformanceFrequency(&frequency);
  return elapsed.QuadPart * 1000 / frequency.QuadPart;
#else
  const int64_t seconds = (tv_end_.tv_sec - tv_start_.tv_sec) * 1000;
  const int64_t milliseconds = (tv_end_.tv_usec - tv_start_.tv_usec) / 1000;
  return seconds + milliseconds;
#endif
}